

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O3

CURLcode telnet_do(connectdata *conn,_Bool *done)

{
  byte *pbVar1;
  undefined4 *puVar2;
  byte bVar3;
  curl_socket_t sockfd;
  Curl_easy *data;
  Curl_easy *pCVar4;
  int *piVar5;
  ulong uVar6;
  undefined4 *puVar7;
  undefined8 uVar8;
  undefined4 uVar9;
  ulong uVar10;
  int iVar11;
  CURLcode CVar12;
  CURLcode CVar13;
  void *pvVar14;
  curl_slist *pcVar15;
  curl_slist *pcVar16;
  size_t sVar17;
  byte *pbVar18;
  timediff_t tVar19;
  ulong uVar20;
  char *pcVar21;
  ulong uVar22;
  ulong uVar23;
  bool bVar24;
  curltime cVar25;
  curltime newer;
  curltime older;
  ssize_t nread;
  pollfd pfd [2];
  uint local_1e8;
  int local_1e0;
  long local_1d0;
  long local_1c8;
  ulong local_1b8 [16];
  pollfd local_138;
  int local_130;
  undefined2 local_12c;
  ushort local_12a;
  
  data = conn->data;
  sockfd = conn->sock[0];
  pcVar21 = (data->state).buffer;
  *done = true;
  pvVar14 = (*Curl_ccalloc)(1,0x1ed0);
  if (pvVar14 == (void *)0x0) {
    CVar12 = CURLE_OUT_OF_MEMORY;
  }
  else {
    pCVar4 = conn->data;
    (pCVar4->req).protop = pvVar14;
    *(undefined4 *)((long)pvVar14 + 0x1ec8) = 0;
    *(long *)((long)pvVar14 + 0x1eb8) = (long)pvVar14 + 0x1cb8;
    *(undefined4 *)((long)pvVar14 + 0x814) = 1;
    *(undefined4 *)((long)pvVar14 + 0x1414) = 1;
    *(undefined4 *)((long)pvVar14 + 0x808) = 1;
    *(undefined8 *)((long)pvVar14 + 0x1408) = 0x100000001;
    *(undefined4 *)((long)pvVar14 + 0x1884) = 1;
    piVar5 = (int *)(data->req).protop;
    local_1b8[0xe] = 0;
    local_1b8[0xf] = 0;
    local_1b8[0xc] = 0;
    local_1b8[0xd] = 0;
    local_1b8[10] = 0;
    local_1b8[0xb] = 0;
    local_1b8[8] = 0;
    local_1b8[9] = 0;
    local_1b8[6] = 0;
    local_1b8[7] = 0;
    local_1b8[4] = 0;
    local_1b8[5] = 0;
    local_1b8[2] = 0;
    local_1b8[3] = 0;
    local_1b8[0] = 0;
    local_1b8[1] = 0;
    memset(&local_138,0,0x100);
    if (((conn->bits).field_0x5 & 1) != 0) {
      curl_msnprintf((char *)&local_138,0x100,"USER,%s");
      pcVar15 = curl_slist_append(*(curl_slist **)((long)pvVar14 + 0x1cb0),(char *)&local_138);
      if (pcVar15 == (curl_slist *)0x0) {
        CVar12 = CURLE_OUT_OF_MEMORY;
LAB_00120eb4:
        curl_slist_free_all(*(curl_slist **)((long)pvVar14 + 0x1cb0));
        *(undefined8 *)((long)pvVar14 + 0x1cb0) = 0;
        return CVar12;
      }
      *(curl_slist **)((long)pvVar14 + 0x1cb0) = pcVar15;
      *(undefined4 *)((long)pvVar14 + 0x8a4) = 1;
    }
    pcVar15 = (pCVar4->set).telnet_options;
    if (pcVar15 != (curl_slist *)0x0) {
      CVar12 = CURLE_TELNET_OPTION_SYNTAX;
      do {
        iVar11 = __isoc99_sscanf(pcVar15->data,"%127[^= ]%*[ =]%255s",local_1b8);
        if (iVar11 != 2) {
LAB_00120e6a:
          pcVar21 = "Syntax error in telnet option: %s";
LAB_00120e71:
          Curl_failf(pCVar4,pcVar21,pcVar15->data);
          goto LAB_00120eb4;
        }
        iVar11 = Curl_strcasecompare((char *)local_1b8,"TTYPE");
        if (iVar11 == 0) {
          iVar11 = Curl_strcasecompare((char *)local_1b8,"XDISPLOC");
          if (iVar11 == 0) {
            iVar11 = Curl_strcasecompare((char *)local_1b8,"NEW_ENV");
            if (iVar11 == 0) {
              iVar11 = Curl_strcasecompare((char *)local_1b8,"WS");
              if (iVar11 == 0) {
                iVar11 = Curl_strcasecompare((char *)local_1b8,"BINARY");
                if (iVar11 == 0) {
                  CVar12 = CURLE_UNKNOWN_OPTION;
                  pcVar21 = "Unknown telnet option %s";
                  goto LAB_00120e71;
                }
                iVar11 = atoi((char *)&local_138);
                if (iVar11 != 1) {
                  *(undefined4 *)((long)pvVar14 + 0x808) = 0;
                  *(undefined4 *)((long)pvVar14 + 0x1408) = 0;
                }
              }
              else {
                iVar11 = __isoc99_sscanf(&local_138,"%hu%*[xX]%hu",(long)pvVar14 + 0x1ca8);
                if (iVar11 != 2) goto LAB_00120e6a;
                *(undefined4 *)((long)pvVar14 + 0x884) = 1;
              }
            }
            else {
              pcVar16 = curl_slist_append(*(curl_slist **)((long)pvVar14 + 0x1cb0),
                                          (char *)&local_138);
              if (pcVar16 == (curl_slist *)0x0) {
                CVar12 = CURLE_OUT_OF_MEMORY;
                goto LAB_00120eb4;
              }
              *(curl_slist **)((long)pvVar14 + 0x1cb0) = pcVar16;
              *(undefined4 *)((long)pvVar14 + 0x8a4) = 1;
            }
          }
          else {
            strncpy((char *)((long)pvVar14 + 0x1c28),(char *)&local_138,0x7f);
            *(undefined1 *)((long)pvVar14 + 0x1ca7) = 0;
            *(undefined4 *)((long)pvVar14 + 0x894) = 1;
          }
        }
        else {
          strncpy((char *)((long)pvVar14 + 0x1c08),(char *)&local_138,0x1f);
          *(undefined1 *)((long)pvVar14 + 0x1c27) = 0;
          *(undefined4 *)((long)pvVar14 + 0x868) = 1;
        }
        pcVar15 = pcVar15->next;
      } while (pcVar15 != (curl_slist *)0x0);
    }
    local_138.events = 1;
    uVar6 = *(ulong *)&(data->set).field_0x8e8;
    local_138.fd = sockfd;
    if ((uVar6 & 1) == 0) {
      local_130 = fileno((FILE *)(data->state).in);
      local_12c = 1;
      local_1e0 = 1000;
      local_1e8 = 2;
    }
    else {
      local_1e0 = 100;
      local_1e8 = 1;
    }
    bVar24 = true;
    local_1c8 = 0;
    local_1d0 = 0;
    CVar12 = CURLE_OK;
    do {
      if (!bVar24) goto LAB_00120e8a;
      iVar11 = Curl_poll(&local_138,local_1e8,local_1e0);
      if (iVar11 == 0) {
        local_138.revents = 0;
        local_12a = 0;
LAB_001205da:
        local_1b8[0] = 0;
        if ((uVar6 & 1) == 0) {
          if ((local_12a & 1) != 0) {
            local_1b8[0] = read(local_130,pcVar21,(data->set).buffer_size);
LAB_0012066d:
            if (0 < (long)local_1b8[0]) {
              CVar13 = send_telnet_data(conn,pcVar21,local_1b8[0]);
              CVar12 = CURLE_OK;
              if (CVar13 == CURLE_OK) {
                local_1c8 = local_1c8 + local_1b8[0];
                Curl_pgrsSetUploadCounter(data,local_1c8);
                goto LAB_00120db1;
              }
              bVar24 = false;
              CVar12 = CVar13;
              goto LAB_00120db3;
            }
          }
          bVar24 = local_1b8[0] == 0;
        }
        else {
          sVar17 = (*(data->state).fread_func)(pcVar21,1,(data->set).buffer_size,(data->state).in);
          local_1b8[0] = (ulong)(int)sVar17;
          if (sVar17 << 0x20 == 0x1000000000000000) {
LAB_00120648:
            bVar24 = false;
          }
          else {
            if (sVar17 << 0x20 != 0x1000000100000000) goto LAB_0012066d;
LAB_00120db1:
            bVar24 = true;
          }
        }
      }
      else {
        if (iVar11 == -1) goto LAB_00120e8a;
        if ((local_138.revents & 1U) == 0) goto LAB_001205da;
        CVar12 = Curl_read(conn,sockfd,pcVar21,(data->set).buffer_size,(ssize_t *)local_1b8);
        if (CVar12 != CURLE_OK) {
          bVar24 = true;
          if (CVar12 == CURLE_AGAIN) goto LAB_00120db3;
          goto LAB_00120648;
        }
        if (0 < (long)local_1b8[0]) {
          local_1d0 = local_1d0 + local_1b8[0];
          Curl_pgrsSetDownloadCounter(data,local_1d0);
          uVar10 = local_1b8[0];
          if (local_1b8[0] != 0) {
            pCVar4 = conn->data;
            puVar7 = (undefined4 *)(pCVar4->req).protop;
            pbVar1 = (byte *)(puVar7 + 0x7ae);
            puVar2 = puVar7 + 0x72e;
            uVar22 = 0xffffffff;
            uVar23 = 0;
            do {
              if (8 < (uint)puVar7[0x7b2]) goto LAB_00120d4d;
              bVar3 = pcVar21[uVar23];
              uVar20 = (ulong)bVar3;
              iVar11 = (int)uVar22;
              switch(puVar7[0x7b2]) {
              case 0:
                if (bVar3 == 0xd) {
                  puVar7[0x7b2] = 6;
                }
                else if (bVar3 == 0xff) {
                  puVar7[0x7b2] = 1;
                  goto LAB_0012091d;
                }
LAB_00120c2c:
                if (iVar11 < 0) {
                  uVar22 = uVar23 & 0xffffffff;
                }
                break;
              case 1:
switchD_00120727_caseD_1:
                switch(bVar3) {
                case 0xfa:
                  *(undefined4 **)(puVar7 + 0x7ae) = puVar2;
LAB_00120a69:
                  puVar7[0x7b2] = 7;
                  break;
                case 0xfb:
                  puVar7[0x7b2] = 2;
                  break;
                case 0xfc:
                  puVar7[0x7b2] = 3;
                  break;
                case 0xfd:
                  puVar7[0x7b2] = 4;
                  break;
                case 0xfe:
                  puVar7[0x7b2] = 5;
                  break;
                case 0xff:
                  puVar7[0x7b2] = 0;
                  goto LAB_00120c2c;
                default:
                  puVar7[0x7b2] = 0;
                  printoption(pCVar4,"RCVD",0xff,(uint)bVar3);
                }
                break;
              case 2:
                printoption(pCVar4,"RCVD",0xfb,(uint)bVar3);
                *puVar7 = 1;
                pvVar14 = (conn->data->req).protop;
                iVar11 = *(int *)((long)pvVar14 + uVar20 * 4 + 0xc08);
                if (iVar11 == 3) {
                  iVar11 = *(int *)((long)pvVar14 + uVar20 * 4 + 0x1008);
                  if (iVar11 != 1) goto LAB_00120b5a;
                  *(undefined4 *)((long)pvVar14 + uVar20 * 4 + 0xc08) = 1;
                  *(undefined4 *)((long)pvVar14 + uVar20 * 4 + 0x1008) = 0;
                }
                else if (iVar11 == 2) {
                  iVar11 = *(int *)((long)pvVar14 + uVar20 * 4 + 0x1008);
                  if (iVar11 == 1) {
                    *(undefined4 *)((long)pvVar14 + uVar20 * 4 + 0xc08) = 3;
                    *(undefined4 *)((long)pvVar14 + uVar20 * 4 + 0x1008) = 0;
                    goto LAB_00120cf7;
                  }
                  if (iVar11 == 0) {
                    *(undefined4 *)((long)pvVar14 + uVar20 * 4 + 0xc08) = 1;
                  }
                }
                else if (iVar11 == 0) {
                  if (*(int *)((long)pvVar14 + uVar20 * 4 + 0x1408) == 1) {
                    *(undefined4 *)((long)pvVar14 + uVar20 * 4 + 0xc08) = 1;
                    goto LAB_00120d17;
                  }
LAB_00120cf7:
                  iVar11 = 0xfe;
                  goto LAB_00120d3c;
                }
                goto LAB_00120d43;
              case 3:
                printoption(pCVar4,"RCVD",0xfc,(uint)bVar3);
                *puVar7 = 1;
                pvVar14 = (conn->data->req).protop;
                iVar11 = *(int *)((long)pvVar14 + uVar20 * 4 + 0xc08);
                if (iVar11 == 3) {
                  iVar11 = *(int *)((long)pvVar14 + uVar20 * 4 + 0x1008);
                  if (iVar11 == 1) {
                    *(undefined4 *)((long)pvVar14 + uVar20 * 4 + 0xc08) = 2;
                    *(undefined4 *)((long)pvVar14 + uVar20 * 4 + 0x1008) = 0;
LAB_00120d17:
                    iVar11 = 0xfd;
                    goto LAB_00120d3c;
                  }
LAB_00120b5a:
                  if (iVar11 == 0) {
                    *(undefined4 *)((long)pvVar14 + uVar20 * 4 + 0xc08) = 0;
                  }
                }
                else if (iVar11 == 2) {
                  iVar11 = *(int *)((long)pvVar14 + uVar20 * 4 + 0x1008);
                  if (iVar11 != 1) goto LAB_00120b5a;
                  *(undefined4 *)((long)pvVar14 + uVar20 * 4 + 0xc08) = 0;
                  *(undefined4 *)((long)pvVar14 + uVar20 * 4 + 0x1008) = 0;
                }
                else if (iVar11 == 1) {
                  *(undefined4 *)((long)pvVar14 + uVar20 * 4 + 0xc08) = 0;
                  goto LAB_00120cf7;
                }
                goto LAB_00120d43;
              case 4:
                printoption(pCVar4,"RCVD",0xfd,(uint)bVar3);
                *puVar7 = 1;
                pvVar14 = (conn->data->req).protop;
                iVar11 = *(int *)((long)pvVar14 + uVar20 * 4 + 8);
                if (iVar11 == 3) {
                  iVar11 = *(int *)((long)pvVar14 + uVar20 * 4 + 0x408);
                  if (iVar11 == 1) {
                    *(undefined4 *)((long)pvVar14 + uVar20 * 4 + 8) = 1;
                    *(undefined4 *)((long)pvVar14 + uVar20 * 4 + 0x408) = 0;
                  }
                  else if (iVar11 == 0) {
                    *(undefined4 *)((long)pvVar14 + uVar20 * 4 + 8) = 0;
                  }
                }
                else if (iVar11 == 2) {
                  iVar11 = *(int *)((long)pvVar14 + uVar20 * 4 + 0x408);
                  if (iVar11 == 1) {
                    *(undefined4 *)((long)pvVar14 + uVar20 * 4 + 8) = 3;
                    *(undefined4 *)((long)pvVar14 + uVar20 * 4 + 0x1008) = 0;
LAB_00120ca8:
                    send_negotiation(conn,0xfc,(uint)bVar3);
                  }
                  else if (iVar11 == 0) {
                    *(undefined4 *)((long)pvVar14 + uVar20 * 4 + 8) = 1;
                    goto LAB_00120a9a;
                  }
                }
                else if (iVar11 == 0) {
                  if (*(int *)((long)pvVar14 + uVar20 * 4 + 0x808) == 1) {
                    *(undefined4 *)((long)pvVar14 + uVar20 * 4 + 8) = 1;
                    send_negotiation(conn,0xfb,(uint)bVar3);
LAB_00120a9a:
                    if (*(int *)((long)pvVar14 + uVar20 * 4 + 0x1808) != 1) goto LAB_00120cd0;
                  }
                  else {
                    if (*(int *)((long)pvVar14 + uVar20 * 4 + 0x1808) != 1) goto LAB_00120ca8;
                    *(undefined4 *)((long)pvVar14 + uVar20 * 4 + 8) = 1;
                    send_negotiation(conn,0xfb,(uint)bVar3);
                  }
                  sendsuboption(conn,(uint)bVar3);
                }
LAB_00120cd0:
                puVar7[0x7b2] = 0;
                break;
              case 5:
                printoption(pCVar4,"RCVD",0xfe,(uint)bVar3);
                *puVar7 = 1;
                pvVar14 = (conn->data->req).protop;
                iVar11 = *(int *)((long)pvVar14 + uVar20 * 4 + 8);
                if (iVar11 == 3) {
                  iVar11 = *(int *)((long)pvVar14 + uVar20 * 4 + 0x408);
                  if (iVar11 == 1) {
                    *(undefined4 *)((long)pvVar14 + uVar20 * 4 + 8) = 2;
                    *(undefined4 *)((long)pvVar14 + uVar20 * 4 + 0x408) = 0;
                    iVar11 = 0xfb;
LAB_00120d3c:
                    send_negotiation(conn,iVar11,(uint)bVar3);
                  }
                  else {
LAB_00120ba0:
                    if (iVar11 == 0) {
                      *(undefined4 *)((long)pvVar14 + uVar20 * 4 + 8) = 0;
                    }
                  }
                }
                else if (iVar11 == 2) {
                  iVar11 = *(int *)((long)pvVar14 + uVar20 * 4 + 0x408);
                  if (iVar11 != 1) goto LAB_00120ba0;
                  *(undefined4 *)((long)pvVar14 + uVar20 * 4 + 8) = 0;
                  *(undefined4 *)((long)pvVar14 + uVar20 * 4 + 0x408) = 0;
                }
                else if (iVar11 == 1) {
                  *(undefined4 *)((long)pvVar14 + uVar20 * 4 + 8) = 0;
                  iVar11 = 0xfc;
                  goto LAB_00120d3c;
                }
                goto LAB_00120d43;
              case 6:
                puVar7[0x7b2] = 0;
                if (bVar3 != 0) goto LAB_00120c2c;
LAB_0012091d:
                if (iVar11 < 0) {
                  uVar22 = 0xffffffff;
                }
                else {
                  CVar12 = Curl_client_write(conn,1,pcVar21 + uVar22,(long)((int)uVar23 - iVar11));
                  uVar22 = 0xffffffff;
                  if (CVar12 != CURLE_OK) goto LAB_00120d8e;
                }
                break;
              case 7:
                if (bVar3 == 0xff) {
                  puVar7[0x7b2] = 8;
                }
                else {
                  pbVar18 = *(byte **)pbVar1;
                  if (pbVar18 < pbVar1) {
                    *(byte **)pbVar1 = pbVar18 + 1;
                    *pbVar18 = bVar3;
                  }
                }
                break;
              case 8:
                pbVar18 = *(byte **)pbVar1;
                if (bVar3 != 0xf0) {
                  if (bVar3 != 0xff) {
                    if (pbVar18 < pbVar1) {
                      *(byte **)pbVar1 = pbVar18 + 1;
                      *pbVar18 = 0xff;
                      pbVar18 = *(byte **)pbVar1;
                    }
                    if (pbVar18 < pbVar1) {
                      *(byte **)pbVar1 = pbVar18 + 1;
                      *pbVar18 = bVar3;
                      pbVar18 = *(byte **)pbVar1;
                    }
                    *(byte **)(puVar7 + 0x7b0) = pbVar18 + -2;
                    *(undefined4 **)(puVar7 + 0x7ae) = puVar2;
                    printoption(pCVar4,"In SUBOPTION processing, RCVD",0xff,(uint)bVar3);
                    suboption(conn);
                    puVar7[0x7b2] = 1;
                    goto switchD_00120727_caseD_1;
                  }
                  if (pbVar18 < pbVar1) {
                    *(byte **)pbVar1 = pbVar18 + 1;
                    *pbVar18 = 0xff;
                  }
                  goto LAB_00120a69;
                }
                if (pbVar18 < pbVar1) {
                  *(byte **)pbVar1 = pbVar18 + 1;
                  *pbVar18 = 0xff;
                  pbVar18 = *(byte **)pbVar1;
                }
                if (pbVar18 < pbVar1) {
                  *(byte **)pbVar1 = pbVar18 + 1;
                  *pbVar18 = 0xf0;
                  pbVar18 = *(byte **)pbVar1;
                }
                *(byte **)(puVar7 + 0x7b0) = pbVar18 + -2;
                *(undefined4 **)(puVar7 + 0x7ae) = puVar2;
                suboption(conn);
LAB_00120d43:
                puVar7[0x7b2] = 0;
              }
LAB_00120d4d:
              uVar23 = uVar23 + 1;
            } while (uVar10 != uVar23);
            if ((-1 < (int)uVar22) &&
               (CVar12 = Curl_client_write(conn,1,pcVar21 + uVar22,(long)((int)uVar10 - (int)uVar22)
                                          ), CVar12 != CURLE_OK)) {
LAB_00120d8e:
              bVar24 = false;
              goto LAB_00120db3;
            }
          }
          CVar12 = CURLE_OK;
          if ((*piVar5 != 0) && (piVar5[1] == 0)) {
            negotiate(conn);
            piVar5[1] = 1;
          }
          goto LAB_001205da;
        }
        bVar24 = false;
        CVar12 = CURLE_OK;
      }
LAB_00120db3:
      if ((data->set).timeout != 0) {
        cVar25 = Curl_now();
        uVar8 = (conn->created).tv_sec;
        uVar9 = (conn->created).tv_usec;
        older.tv_usec = uVar9;
        older.tv_sec = uVar8;
        newer._12_4_ = 0;
        newer.tv_sec = SUB128(cVar25._0_12_,0);
        newer.tv_usec = SUB124(cVar25._0_12_,8);
        older._12_4_ = 0;
        tVar19 = Curl_timediff(newer,older);
        if ((data->set).timeout <= tVar19) {
          bVar24 = false;
          Curl_failf(data,"Time-out");
          CVar12 = CURLE_OPERATION_TIMEDOUT;
        }
      }
      iVar11 = Curl_pgrsUpdate(conn);
    } while (iVar11 == 0);
    CVar12 = CURLE_ABORTED_BY_CALLBACK;
LAB_00120e8a:
    Curl_setup_transfer(data,-1,-1,false,-1);
  }
  return CVar12;
}

Assistant:

static CURLcode telnet_do(struct connectdata *conn, bool *done)
{
  CURLcode result;
  struct Curl_easy *data = conn->data;
  curl_socket_t sockfd = conn->sock[FIRSTSOCKET];
#ifdef USE_WINSOCK
  HMODULE wsock2;
  WSOCK2_FUNC close_event_func;
  WSOCK2_EVENT create_event_func;
  WSOCK2_FUNC event_select_func;
  WSOCK2_FUNC enum_netevents_func;
  WSAEVENT event_handle;
  WSANETWORKEVENTS events;
  HANDLE stdin_handle;
  HANDLE objs[2];
  DWORD  obj_count;
  DWORD  wait_timeout;
  DWORD readfile_read;
  int err;
#else
  int interval_ms;
  struct pollfd pfd[2];
  int poll_cnt;
  curl_off_t total_dl = 0;
  curl_off_t total_ul = 0;
#endif
  ssize_t nread;
  struct curltime now;
  bool keepon = TRUE;
  char *buf = data->state.buffer;
  struct TELNET *tn;

  *done = TRUE; /* unconditionally */

  result = init_telnet(conn);
  if(result)
    return result;

  tn = (struct TELNET *)data->req.protop;

  result = check_telnet_options(conn);
  if(result)
    return result;

#ifdef USE_WINSOCK
  /*
  ** This functionality only works with WinSock >= 2.0.  So,
  ** make sure we have it.
  */
  result = check_wsock2(data);
  if(result)
    return result;

  /* OK, so we have WinSock 2.0.  We need to dynamically */
  /* load ws2_32.dll and get the function pointers we need. */
  wsock2 = Curl_load_library(TEXT("WS2_32.DLL"));
  if(wsock2 == NULL) {
    failf(data, "failed to load WS2_32.DLL (%u)", GetLastError());
    return CURLE_FAILED_INIT;
  }

  /* Grab a pointer to WSACreateEvent */
  create_event_func =
    CURLX_FUNCTION_CAST(WSOCK2_EVENT,
                        (GetProcAddress(wsock2, "WSACreateEvent")));
  if(create_event_func == NULL) {
    failf(data, "failed to find WSACreateEvent function (%u)", GetLastError());
    FreeLibrary(wsock2);
    return CURLE_FAILED_INIT;
  }

  /* And WSACloseEvent */
  close_event_func = GetProcAddress(wsock2, "WSACloseEvent");
  if(close_event_func == NULL) {
    failf(data, "failed to find WSACloseEvent function (%u)", GetLastError());
    FreeLibrary(wsock2);
    return CURLE_FAILED_INIT;
  }

  /* And WSAEventSelect */
  event_select_func = GetProcAddress(wsock2, "WSAEventSelect");
  if(event_select_func == NULL) {
    failf(data, "failed to find WSAEventSelect function (%u)", GetLastError());
    FreeLibrary(wsock2);
    return CURLE_FAILED_INIT;
  }

  /* And WSAEnumNetworkEvents */
  enum_netevents_func = GetProcAddress(wsock2, "WSAEnumNetworkEvents");
  if(enum_netevents_func == NULL) {
    failf(data, "failed to find WSAEnumNetworkEvents function (%u)",
          GetLastError());
    FreeLibrary(wsock2);
    return CURLE_FAILED_INIT;
  }

  /* We want to wait for both stdin and the socket. Since
  ** the select() function in winsock only works on sockets
  ** we have to use the WaitForMultipleObjects() call.
  */

  /* First, create a sockets event object */
  event_handle = (WSAEVENT)create_event_func();
  if(event_handle == WSA_INVALID_EVENT) {
    failf(data, "WSACreateEvent failed (%d)", SOCKERRNO);
    FreeLibrary(wsock2);
    return CURLE_FAILED_INIT;
  }

  /* Tell winsock what events we want to listen to */
  if(event_select_func(sockfd, event_handle, FD_READ|FD_CLOSE) ==
     SOCKET_ERROR) {
    close_event_func(event_handle);
    FreeLibrary(wsock2);
    return CURLE_OK;
  }

  /* The get the Windows file handle for stdin */
  stdin_handle = GetStdHandle(STD_INPUT_HANDLE);

  /* Create the list of objects to wait for */
  objs[0] = event_handle;
  objs[1] = stdin_handle;

  /* If stdin_handle is a pipe, use PeekNamedPipe() method to check it,
     else use the old WaitForMultipleObjects() way */
  if(GetFileType(stdin_handle) == FILE_TYPE_PIPE ||
     data->set.is_fread_set) {
    /* Don't wait for stdin_handle, just wait for event_handle */
    obj_count = 1;
    /* Check stdin_handle per 100 milliseconds */
    wait_timeout = 100;
  }
  else {
    obj_count = 2;
    wait_timeout = 1000;
  }

  /* Keep on listening and act on events */
  while(keepon) {
    const DWORD buf_size = (DWORD)data->set.buffer_size;
    DWORD waitret = WaitForMultipleObjects(obj_count, objs,
                                           FALSE, wait_timeout);
    switch(waitret) {
    case WAIT_TIMEOUT:
    {
      for(;;) {
        if(data->set.is_fread_set) {
          size_t n;
          /* read from user-supplied method */
          n = data->state.fread_func(buf, 1, buf_size, data->state.in);
          if(n == CURL_READFUNC_ABORT) {
            keepon = FALSE;
            result = CURLE_READ_ERROR;
            break;
          }

          if(n == CURL_READFUNC_PAUSE)
            break;

          if(n == 0)                        /* no bytes */
            break;

          /* fall through with number of bytes read */
          readfile_read = (DWORD)n;
        }
        else {
          /* read from stdin */
          if(!PeekNamedPipe(stdin_handle, NULL, 0, NULL,
                            &readfile_read, NULL)) {
            keepon = FALSE;
            result = CURLE_READ_ERROR;
            break;
          }

          if(!readfile_read)
            break;

          if(!ReadFile(stdin_handle, buf, buf_size,
                       &readfile_read, NULL)) {
            keepon = FALSE;
            result = CURLE_READ_ERROR;
            break;
          }
        }

        result = send_telnet_data(conn, buf, readfile_read);
        if(result) {
          keepon = FALSE;
          break;
        }
      }
    }
    break;

    case WAIT_OBJECT_0 + 1:
    {
      if(!ReadFile(stdin_handle, buf, buf_size,
                   &readfile_read, NULL)) {
        keepon = FALSE;
        result = CURLE_READ_ERROR;
        break;
      }

      result = send_telnet_data(conn, buf, readfile_read);
      if(result) {
        keepon = FALSE;
        break;
      }
    }
    break;

    case WAIT_OBJECT_0:

      events.lNetworkEvents = 0;
      if(SOCKET_ERROR == enum_netevents_func(sockfd, event_handle, &events)) {
        err = SOCKERRNO;
        if(err != EINPROGRESS) {
          infof(data, "WSAEnumNetworkEvents failed (%d)", err);
          keepon = FALSE;
          result = CURLE_READ_ERROR;
        }
        break;
      }
      if(events.lNetworkEvents & FD_READ) {
        /* read data from network */
        result = Curl_read(conn, sockfd, buf, data->set.buffer_size, &nread);
        /* read would've blocked. Loop again */
        if(result == CURLE_AGAIN)
          break;
        /* returned not-zero, this an error */
        else if(result) {
          keepon = FALSE;
          break;
        }
        /* returned zero but actually received 0 or less here,
           the server closed the connection and we bail out */
        else if(nread <= 0) {
          keepon = FALSE;
          break;
        }

        result = telrcv(conn, (unsigned char *) buf, nread);
        if(result) {
          keepon = FALSE;
          break;
        }

        /* Negotiate if the peer has started negotiating,
           otherwise don't. We don't want to speak telnet with
           non-telnet servers, like POP or SMTP. */
        if(tn->please_negotiate && !tn->already_negotiated) {
          negotiate(conn);
          tn->already_negotiated = 1;
        }
      }
      if(events.lNetworkEvents & FD_CLOSE) {
        keepon = FALSE;
      }
      break;

    }

    if(data->set.timeout) {
      now = Curl_now();
      if(Curl_timediff(now, conn->created) >= data->set.timeout) {
        failf(data, "Time-out");
        result = CURLE_OPERATION_TIMEDOUT;
        keepon = FALSE;
      }
    }
  }

  /* We called WSACreateEvent, so call WSACloseEvent */
  if(!close_event_func(event_handle)) {
    infof(data, "WSACloseEvent failed (%d)", SOCKERRNO);
  }

  /* "Forget" pointers into the library we're about to free */
  create_event_func = NULL;
  close_event_func = NULL;
  event_select_func = NULL;
  enum_netevents_func = NULL;

  /* We called LoadLibrary, so call FreeLibrary */
  if(!FreeLibrary(wsock2))
    infof(data, "FreeLibrary(wsock2) failed (%u)", GetLastError());
#else
  pfd[0].fd = sockfd;
  pfd[0].events = POLLIN;

  if(data->set.is_fread_set) {
    poll_cnt = 1;
    interval_ms = 100; /* poll user-supplied read function */
  }
  else {
    /* really using fread, so infile is a FILE* */
    pfd[1].fd = fileno((FILE *)data->state.in);
    pfd[1].events = POLLIN;
    poll_cnt = 2;
    interval_ms = 1 * 1000;
  }

  while(keepon) {
    switch(Curl_poll(pfd, poll_cnt, interval_ms)) {
    case -1:                    /* error, stop reading */
      keepon = FALSE;
      continue;
    case 0:                     /* timeout */
      pfd[0].revents = 0;
      pfd[1].revents = 0;
      /* FALLTHROUGH */
    default:                    /* read! */
      if(pfd[0].revents & POLLIN) {
        /* read data from network */
        result = Curl_read(conn, sockfd, buf, data->set.buffer_size, &nread);
        /* read would've blocked. Loop again */
        if(result == CURLE_AGAIN)
          break;
        /* returned not-zero, this an error */
        if(result) {
          keepon = FALSE;
          break;
        }
        /* returned zero but actually received 0 or less here,
           the server closed the connection and we bail out */
        else if(nread <= 0) {
          keepon = FALSE;
          break;
        }

        total_dl += nread;
        Curl_pgrsSetDownloadCounter(data, total_dl);
        result = telrcv(conn, (unsigned char *)buf, nread);
        if(result) {
          keepon = FALSE;
          break;
        }

        /* Negotiate if the peer has started negotiating,
           otherwise don't. We don't want to speak telnet with
           non-telnet servers, like POP or SMTP. */
        if(tn->please_negotiate && !tn->already_negotiated) {
          negotiate(conn);
          tn->already_negotiated = 1;
        }
      }

      nread = 0;
      if(poll_cnt == 2) {
        if(pfd[1].revents & POLLIN) { /* read from in file */
          nread = read(pfd[1].fd, buf, data->set.buffer_size);
        }
      }
      else {
        /* read from user-supplied method */
        nread = (int)data->state.fread_func(buf, 1, data->set.buffer_size,
                                            data->state.in);
        if(nread == CURL_READFUNC_ABORT) {
          keepon = FALSE;
          break;
        }
        if(nread == CURL_READFUNC_PAUSE)
          break;
      }

      if(nread > 0) {
        result = send_telnet_data(conn, buf, nread);
        if(result) {
          keepon = FALSE;
          break;
        }
        total_ul += nread;
        Curl_pgrsSetUploadCounter(data, total_ul);
      }
      else if(nread < 0)
        keepon = FALSE;

      break;
    } /* poll switch statement */

    if(data->set.timeout) {
      now = Curl_now();
      if(Curl_timediff(now, conn->created) >= data->set.timeout) {
        failf(data, "Time-out");
        result = CURLE_OPERATION_TIMEDOUT;
        keepon = FALSE;
      }
    }

    if(Curl_pgrsUpdate(conn)) {
      result = CURLE_ABORTED_BY_CALLBACK;
      break;
    }
  }
#endif
  /* mark this as "no further transfer wanted" */
  Curl_setup_transfer(data, -1, -1, FALSE, -1);

  return result;
}